

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_ls.c
# Opt level: O2

int CVodeGetNumJacEvals(void *cvode_mem,long *njevals)

{
  int iVar1;
  CVLsMem cvls_mem;
  CVodeMem cv_mem;
  CVLsMem local_18;
  CVodeMem local_10;
  
  iVar1 = cvLs_AccessLMem(cvode_mem,"CVodeGetNumJacEvals",&local_10,&local_18);
  if (iVar1 == 0) {
    *njevals = local_18->nje;
  }
  return iVar1;
}

Assistant:

int CVodeGetNumJacEvals(void* cvode_mem, long int* njevals)
{
  CVodeMem cv_mem;
  CVLsMem cvls_mem;
  int retval;

  /* access CVLsMem structure; set output value and return */
  retval = cvLs_AccessLMem(cvode_mem, __func__, &cv_mem, &cvls_mem);
  if (retval != CVLS_SUCCESS) { return (retval); }
  *njevals = cvls_mem->nje;
  return (CVLS_SUCCESS);
}